

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PrimQuadUV
          (ImDrawList *this,ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *d,ImVec2 *uv_a,ImVec2 *uv_b,
          ImVec2 *uv_c,ImVec2 *uv_d,ImU32 col)

{
  uint uVar1;
  uint *puVar2;
  ImDrawVert *pIVar3;
  
  uVar1 = this->_VtxCurrentIdx;
  puVar2 = this->_IdxWritePtr;
  *puVar2 = uVar1;
  puVar2[1] = uVar1 + 1;
  puVar2[2] = uVar1 + 2;
  puVar2[3] = uVar1;
  puVar2[4] = uVar1 + 2;
  puVar2[5] = uVar1 + 3;
  this->_VtxWritePtr->pos = *a;
  this->_VtxWritePtr->uv = *uv_a;
  pIVar3 = this->_VtxWritePtr;
  pIVar3->col = col;
  pIVar3[1].pos = *b;
  this->_VtxWritePtr[1].uv = *uv_b;
  pIVar3 = this->_VtxWritePtr;
  pIVar3[1].col = col;
  pIVar3[2].pos = *c;
  this->_VtxWritePtr[2].uv = *uv_c;
  pIVar3 = this->_VtxWritePtr;
  pIVar3[2].col = col;
  pIVar3[3].pos = *d;
  this->_VtxWritePtr[3].uv = *uv_d;
  pIVar3 = this->_VtxWritePtr;
  pIVar3[3].col = col;
  this->_VtxWritePtr = pIVar3 + 4;
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + 4;
  this->_IdxWritePtr = this->_IdxWritePtr + 6;
  return;
}

Assistant:

void ImDrawList::PrimQuadUV(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& d, const ImVec2& uv_a, const ImVec2& uv_b, const ImVec2& uv_c, const ImVec2& uv_d, ImU32 col)
{
    ImDrawIdx idx = (ImDrawIdx)_VtxCurrentIdx;
    _IdxWritePtr[0] = idx; _IdxWritePtr[1] = (ImDrawIdx)(idx+1); _IdxWritePtr[2] = (ImDrawIdx)(idx+2);
    _IdxWritePtr[3] = idx; _IdxWritePtr[4] = (ImDrawIdx)(idx+2); _IdxWritePtr[5] = (ImDrawIdx)(idx+3);
    _VtxWritePtr[0].pos = a; _VtxWritePtr[0].uv = uv_a; _VtxWritePtr[0].col = col;
    _VtxWritePtr[1].pos = b; _VtxWritePtr[1].uv = uv_b; _VtxWritePtr[1].col = col;
    _VtxWritePtr[2].pos = c; _VtxWritePtr[2].uv = uv_c; _VtxWritePtr[2].col = col;
    _VtxWritePtr[3].pos = d; _VtxWritePtr[3].uv = uv_d; _VtxWritePtr[3].col = col;
    _VtxWritePtr += 4;
    _VtxCurrentIdx += 4;
    _IdxWritePtr += 6;
}